

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O3

int __thiscall hierarchy_info::init(hierarchy_info *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  char cVar2;
  kmp_uint32 *pkVar3;
  bool bVar4;
  undefined8 in_RAX;
  undefined7 uVar6;
  kmp_uint32 *pkVar5;
  uint uVar7;
  long lVar8;
  uint in_EDX;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  EVP_PKEY_CTX *pEVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  kmp_uint32 kVar16;
  long lVar17;
  
  uVar6 = (undefined7)((ulong)in_RAX >> 8);
  iVar15 = (int)CONCAT71(uVar6,1);
  LOCK();
  cVar2 = this->uninitialized;
  if (cVar2 == '\x01') {
    this->uninitialized = '\x02';
  }
  else {
    iVar15 = (int)CONCAT71(uVar6,cVar2);
  }
  UNLOCK();
  if (cVar2 == '\x01') {
    this->resizing = '\0';
    this->maxLevels = 7;
    this->depth = 1;
    pkVar5 = (kmp_uint32 *)___kmp_allocate(0x38);
    this->numPerLevel = pkVar5;
    uVar7 = this->maxLevels;
    this->skipPerLevel = pkVar5 + uVar7;
    if ((ulong)uVar7 != 0) {
      uVar10 = 0;
      do {
        pkVar5[uVar10] = 1;
        (pkVar5 + uVar7)[uVar10] = 1;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->maxLevels);
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      *pkVar5 = 4;
      pkVar5[1] = in_EDX >> 2;
      if ((in_EDX & 3) != 0) {
        pkVar5[1] = (in_EDX >> 2) + 1;
      }
    }
    else {
      qsort(ctx,(long)(int)in_EDX,0x10c,__kmp_affinity_cmp_Address_labels);
      lVar8 = (long)*(int *)(ctx + 0x100);
      pkVar5 = this->numPerLevel;
      if (0 < lVar8) {
        pEVar12 = ctx + lVar8 * 4 + 0x7c;
        lVar14 = 0;
        do {
          kVar16 = 0;
          if (0 < (int)in_EDX) {
            iVar15 = -1;
            lVar17 = 0;
            do {
              if (iVar15 < *(int *)(pEVar12 + lVar17)) {
                iVar15 = *(int *)(pEVar12 + lVar17);
              }
              lVar17 = lVar17 + 0x10c;
            } while ((ulong)in_EDX * 0x10c - lVar17 != 0);
            kVar16 = iVar15 + 1;
          }
          pkVar5[lVar14] = kVar16;
          lVar14 = lVar14 + 1;
          pEVar12 = pEVar12 + -4;
        } while (lVar14 != lVar8);
      }
    }
    this->base_num_threads = in_EDX;
    uVar7 = this->depth;
    uVar9 = this->maxLevels - 1;
    if (-1 < (int)uVar9) {
      lVar8 = (ulong)uVar9 + 1;
      do {
        if (1 < uVar7 || pkVar5[lVar8 + -1] != 1) {
          uVar7 = uVar7 + 1;
          this->depth = uVar7;
        }
        lVar14 = lVar8 + -1;
        bVar4 = 0 < lVar8;
        lVar8 = lVar14;
      } while (lVar14 != 0 && bVar4);
    }
    uVar10 = 1;
    if (uVar7 != 1) {
      uVar7 = in_EDX >> 2;
      if (in_EDX >> 2 < 5) {
        uVar7 = 4;
      }
      uVar11 = (ulong)uVar7;
      if (*pkVar5 != 1) {
        uVar11 = 4;
      }
      uVar13 = 0;
      do {
        uVar1 = uVar13 + 1;
        while( true ) {
          uVar7 = pkVar5[uVar13];
          if ((uVar7 <= (uint)uVar11) && (uVar13 != 0 || uVar7 < 5)) break;
          pkVar5[uVar13] = (uVar7 & 1) + uVar7 >> 1;
          kVar16 = pkVar5[uVar1];
          if (kVar16 == 1) {
            this->depth = this->depth + 1;
            kVar16 = pkVar5[uVar1];
          }
          pkVar5[uVar1] = kVar16 * 2;
        }
        uVar10 = uVar11 >> 1;
        if ((uint)uVar10 < 5) {
          uVar10 = 4;
        }
        if (*pkVar5 == 1) {
          uVar11 = uVar10;
        }
        uVar7 = this->depth;
        uVar10 = (ulong)uVar7;
        uVar13 = uVar1;
      } while (uVar1 < uVar7 - 1);
      if (1 < uVar7) {
        pkVar3 = this->skipPerLevel;
        kVar16 = *pkVar3;
        uVar11 = 1;
        do {
          kVar16 = kVar16 * pkVar5[uVar11 - 1];
          pkVar3[uVar11] = kVar16;
          uVar11 = uVar11 + 1;
          uVar10 = (ulong)this->depth;
        } while (uVar11 < uVar10);
      }
    }
    if ((uint)uVar10 < this->maxLevels) {
      pkVar5 = this->skipPerLevel;
      do {
        pkVar5[uVar10] = pkVar5[(int)uVar10 - 1] * 2;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->maxLevels);
    }
    iVar15 = (int)pkVar5;
    this->uninitialized = '\0';
  }
  else {
    do {
    } while (this->uninitialized != '\0');
  }
  return iVar15;
}

Assistant:

void init(AddrUnsPair *adr2os, int num_addrs) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(
        &uninitialized, not_initialized, initializing);
    if (bool_result == 0) { // Wait for initialization
      while (TCR_1(uninitialized) != initialized)
        KMP_CPU_PAUSE();
      return;
    }
    KMP_DEBUG_ASSERT(bool_result == 1);

    /* Added explicit initialization of the data fields here to prevent usage of
       dirty value observed when static library is re-initialized multiple times
       (e.g. when non-OpenMP thread repeatedly launches/joins thread that uses
       OpenMP). */
    depth = 1;
    resizing = 0;
    maxLevels = 7;
    numPerLevel =
        (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
    skipPerLevel = &(numPerLevel[maxLevels]);
    for (kmp_uint32 i = 0; i < maxLevels;
         ++i) { // init numPerLevel[*] to 1 item per level
      numPerLevel[i] = 1;
      skipPerLevel[i] = 1;
    }

    // Sort table by physical ID
    if (adr2os) {
      qsort(adr2os, num_addrs, sizeof(*adr2os),
            __kmp_affinity_cmp_Address_labels);
      deriveLevels(adr2os, num_addrs);
    } else {
      numPerLevel[0] = maxLeaves;
      numPerLevel[1] = num_addrs / maxLeaves;
      if (num_addrs % maxLeaves)
        numPerLevel[1]++;
    }

    base_num_threads = num_addrs;
    for (int i = maxLevels - 1; i >= 0;
         --i) // count non-empty levels to get depth
      if (numPerLevel[i] != 1 || depth > 1) // only count one top-level '1'
        depth++;

    kmp_uint32 branch = minBranch;
    if (numPerLevel[0] == 1)
      branch = num_addrs / maxLeaves;
    if (branch < minBranch)
      branch = minBranch;
    for (kmp_uint32 d = 0; d < depth - 1; ++d) { // optimize hierarchy width
      while (numPerLevel[d] > branch ||
             (d == 0 && numPerLevel[d] > maxLeaves)) { // max 4 on level 0!
        if (numPerLevel[d] & 1)
          numPerLevel[d]++;
        numPerLevel[d] = numPerLevel[d] >> 1;
        if (numPerLevel[d + 1] == 1)
          depth++;
        numPerLevel[d + 1] = numPerLevel[d + 1] << 1;
      }
      if (numPerLevel[0] == 1) {
        branch = branch >> 1;
        if (branch < 4)
          branch = minBranch;
      }
    }

    for (kmp_uint32 i = 1; i < depth; ++i)
      skipPerLevel[i] = numPerLevel[i - 1] * skipPerLevel[i - 1];
    // Fill in hierarchy in the case of oversubscription
    for (kmp_uint32 i = depth; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    uninitialized = initialized; // One writer
  }